

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

string_view __thiscall kratos::SystemVerilogCodeGen::indent(SystemVerilogCodeGen *this)

{
  uint uVar1;
  uint64_t uVar2;
  pointer pcVar3;
  uint32_t i;
  ulong uVar4;
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view sVar6;
  size_type *local_38;
  string result;
  
  if (this->skip_indent_ == true) {
    this->skip_indent_ = false;
    bVar5 = (basic_string_view<char,_std::char_traits<char>_>)(ZEXT816(0x217505) << 0x40);
  }
  else {
    uVar2 = this->indent_;
    uVar1 = this->indent_size;
    __n = uVar2 * uVar1;
    if ((this->empty_indent_str_)._M_string_length < __n) {
      local_38 = &result._M_string_length;
      result._M_dataplus._M_p = (pointer)0x0;
      result._M_string_length._0_1_ = 0;
      std::__cxx11::string::resize((ulong)&local_38);
      for (uVar4 = 0; (int)uVar2 * uVar1 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined1 *)((long)local_38 + uVar4) = 0x20;
      }
      std::__cxx11::string::_M_assign((string *)&this->empty_indent_str_);
      pcVar3 = (this->empty_indent_str_)._M_dataplus._M_p;
      (this->empty_indent_string_view_)._M_len = (this->empty_indent_str_)._M_string_length;
      (this->empty_indent_string_view_)._M_str = pcVar3;
      std::__cxx11::string::~string((string *)&local_38);
      __n = (ulong)this->indent_size * this->indent_;
    }
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&this->empty_indent_string_view_,0,__n);
  }
  sVar6._M_len = bVar5._M_len;
  sVar6._M_str = bVar5._M_str;
  return sVar6;
}

Assistant:

std::string_view SystemVerilogCodeGen::indent() {
    if (skip_indent_) {
        skip_indent_ = false;
        return "";
    }
    if (empty_indent_str_.size() < (indent_ * indent_size)) {
        // need to expand the string
        std::string result;
        uint32_t num_indent = indent_ * indent_size;
        result.resize(num_indent);
        for (uint32_t i = 0; i < num_indent; i++) result[i] = ' ';
        empty_indent_str_ = result;
        empty_indent_string_view_ = empty_indent_str_;
    }
    return empty_indent_string_view_.substr(0, indent_ * indent_size);
}